

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseDataList
                 (char *in,char *end,ValueType type,Value **data,size_t *numValues,Reference **refs,
                 size_t *numRefs)

{
  pointer names_00;
  pointer ppNVar1;
  uint uVar2;
  byte *in_00;
  Reference *this;
  byte *pbVar3;
  byte bVar4;
  bool bVar5;
  ValueType integerType;
  byte *pbVar6;
  ulong uVar7;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Value *local_80;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> local_78;
  Value **local_60;
  size_t *local_58;
  Value *local_50;
  Reference **local_48;
  ulong local_40;
  ulong local_38;
  
  uVar7 = (ulong)(uint)type;
  *data = (Value *)0x0;
  *numRefs = 0;
  *numValues = 0;
  if (in != end && in != (char *)0x0) {
    do {
      bVar4 = *in;
      if ((0x2c < (ulong)bVar4) || ((0x100100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0))
      goto LAB_0066ede0;
      in = (char *)((byte *)in + 1);
    } while (in != end);
    bVar4 = *end;
    in = end;
LAB_0066ede0:
    if (bVar4 == 0x7b) {
      pbVar6 = (byte *)in + 1;
      if (((byte *)in)[1] != 0x7d) {
        local_50 = (Value *)0x0;
        local_38 = (ulong)(uint)(type + ddl_int8);
        local_60 = data;
        local_58 = numValues;
        local_48 = refs;
        local_40 = uVar7;
LAB_0066ee27:
        local_80 = (Value *)0x0;
        in_00 = pbVar6;
        while (((pbVar6 != (byte *)end && (in_00 = pbVar6, (ulong)*pbVar6 < 0x2d)) &&
               ((0x100100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
          pbVar6 = pbVar6 + 1;
          in_00 = (byte *)end;
        }
        if (0xe < (uint)local_38) goto switchD_0066ee66_caseD_66f148;
        integerType = (ValueType)uVar7;
        switch((long)&switchD_0066ee66::switchdataD_006fd0d0 +
               (long)(int)(&switchD_0066ee66::switchdataD_006fd0d0)[local_38]) {
        case 0x66ee68:
LAB_0066ee73:
          in_00 = (byte *)parseIntegerLiteral((char *)in_00,end,&local_80,integerType);
          break;
        case 0x66ee7d:
LAB_0066ee88:
          in_00 = (byte *)parseFloatingLiteral((char *)in_00,end,&local_80,integerType);
          break;
        case 0x66ee92:
          pbVar6 = in_00;
          if (in_00 != (byte *)end) {
            pbVar6 = in_00 + (*in_00 == 0x2d);
          }
          bVar5 = false;
          do {
            bVar4 = *pbVar6;
            if ((((ulong)bVar4 < 0x2d) && ((0x100100000200U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
               ((bVar4 == 0x7d || ((pbVar6 == (byte *)end || (bVar4 == 0x29)))))) {
              if (bVar5) {
                integerType = ddl_int32;
                goto LAB_0066ee73;
              }
              break;
            }
            pbVar6 = pbVar6 + 1;
            bVar5 = true;
          } while ((byte)(bVar4 - 0x30) < 10);
          pbVar6 = in_00;
          if (in_00 != (byte *)end) {
            pbVar6 = in_00 + (*in_00 == 0x2d);
          }
          bVar5 = false;
          pbVar3 = pbVar6;
          while( true ) {
            pbVar3 = pbVar3 + 1;
            bVar4 = *pbVar6;
            if ((((ulong)bVar4 < 0x2d) && ((0x100100000200U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
               (bVar4 == 0x7d)) goto LAB_0066f05f;
            if ((pbVar6 == (byte *)end) || (bVar4 == 0x29)) break;
            if (bVar4 == 0x2e) {
              bVar5 = true;
              goto LAB_0066f011;
            }
            if (9 < (byte)(bVar4 - 0x30)) goto LAB_0066f05f;
            pbVar6 = pbVar6 + 1;
            bVar5 = true;
          }
          if (bVar4 == 0x2e) goto LAB_0066f011;
          goto LAB_0066f05f;
        case 0x66eef1:
          local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (Name **)0x0;
          local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (Name **)0x0;
          local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          in_00 = (byte *)parseReference((char *)in_00,end,&local_78);
          ppNVar1 = local_78.
                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          names_00 = local_78.
                     super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            this = (Reference *)operator_new(0x10);
            Reference::Reference(this,(long)ppNVar1 - (long)names_00 >> 3,names_00);
            *local_48 = this;
            *numRefs = (long)local_78.
                             super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78.
                             super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3;
          }
          numValues = local_58;
          data = local_60;
          uVar7 = local_40;
          if (local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (Name **)0x0) {
            operator_delete(local_78.
                            super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            uVar7 = local_40;
          }
          break;
        case 0x66f074:
          goto switchD_0066ee66_caseD_66f074;
        case 0x66f148:
          goto switchD_0066ee66_caseD_66f148;
        }
        goto LAB_0066f084;
      }
LAB_0066f168:
      in = (char *)(pbVar6 + 1);
    }
  }
  return in;
  while( true ) {
    pbVar3 = pbVar3 + 1;
    bVar5 = true;
    if (9 < (byte)(bVar4 - 0x30)) break;
LAB_0066f011:
    bVar4 = *pbVar3;
    if ((((ulong)bVar4 < 0x2d) && ((0x100100000200U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
       ((bVar4 == 0x7d || ((pbVar3 == (byte *)end || (bVar4 == 0x29)))))) {
      if (bVar5) {
        integerType = ddl_float;
        goto LAB_0066ee88;
      }
      break;
    }
  }
LAB_0066f05f:
  if (*in_00 == 0x30) {
    if ((in_00 + 1 != (byte *)end) && ((in_00[1] + 0xa8 & 0xdf) == 0)) {
      in_00 = (byte *)parseHexaLiteral((char *)in_00,end,&local_80);
      goto LAB_0066f084;
    }
  }
  else if (*in_00 == 0x22) {
switchD_0066ee66_caseD_66f074:
    in_00 = (byte *)parseStringLiteral((char *)in_00,end,&local_80);
    goto LAB_0066f084;
  }
switchD_0066ee66_caseD_66f148:
LAB_0066f084:
  if (local_80 != (Value *)0x0) {
    if (*data == (Value *)0x0) {
      *data = local_80;
    }
    else {
      Value::setNext(local_50,local_80);
    }
    *numValues = *numValues + 1;
    local_50 = local_80;
  }
  do {
    do {
      pbVar6 = in_00;
      bVar4 = *pbVar6;
      in_00 = pbVar6 + 1;
    } while (pbVar6 == (byte *)end);
  } while ((((bVar4 & 0xdf) != 0x5b && (bVar4 & 0xfe) != 0x28) &&
           (bVar4 != 0x2c && (bVar4 != 0x20 && bVar4 != 9))) && bVar4 != 0x7d);
  uVar2 = (uint)bVar4;
  if ((((0x2c < uVar2) || ((0x100100000200U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) && (uVar2 != 0x7d))
     || (uVar2 == 0x7d)) goto LAB_0066f168;
  goto LAB_0066ee27;
}

Assistant:

char *OpenDDLParser::parseDataList( char *in, char *end, Value::ValueType type, Value **data, 
                                    size_t &numValues, Reference **refs, size_t &numRefs ) {
    *data = ddl_nullptr;
    numValues = numRefs = 0;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in == '{' ) {
        ++in;
        Value *current( ddl_nullptr ), *prev( ddl_nullptr );
        while( '}' != *in ) {
            current = ddl_nullptr;
            in = lookForNextToken( in, end );
            if ( Value::ddl_ref == type ) {
                std::vector<Name*> names;
                in = parseReference( in, end, names );
                if ( !names.empty() ) {
                    Reference *ref = new Reference( names.size(), &names[ 0 ] );
                    *refs = ref;
                    numRefs = names.size();
                }
            } else  if ( Value::ddl_none == type ) {
                if (isInteger( in, end )) {
                    in = parseIntegerLiteral( in, end, &current );
                } else if (isFloat( in, end )) {
                    in = parseFloatingLiteral( in, end, &current );
                } else if (isStringLiteral( *in )) {
                    in = parseStringLiteral( in, end, &current );
                } else if (isHexLiteral( in, end )) {
                    in = parseHexaLiteral( in, end, &current );
                }
            } else {
                switch(type){
                    case Value::ddl_int8:
                    case Value::ddl_int16:
                    case Value::ddl_int32:
                    case Value::ddl_int64:
                    case Value::ddl_unsigned_int8:
                    case Value::ddl_unsigned_int16:
                    case Value::ddl_unsigned_int32:
                    case Value::ddl_unsigned_int64:
                        in = parseIntegerLiteral( in, end, &current, type);
                        break;
                    case Value::ddl_half:
                    case Value::ddl_float:
                    case Value::ddl_double:
                        in = parseFloatingLiteral( in, end, &current, type);
                        break;
                    case Value::ddl_string:
                        in = parseStringLiteral( in, end, &current );
                        break;
                    default:
                        break;
                }
            }

            if( ddl_nullptr != current ) {
                if( ddl_nullptr == *data ) {
                    *data = current;
                    prev = current;
                } else {
                    prev->setNext( current );
                    prev = current;
                }
                ++numValues;
            }

            in = getNextSeparator( in, end );
            if( ',' != *in && Grammar::CloseBracketToken[ 0 ] != *in && !isSpace( *in ) ) {
                break;
            }
        }
        ++in;
    }

    return in;
}